

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int re_parse_disjunction(REParseState *s,BOOL is_backward_dir)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REParseState *in_RDI;
  BOOL unaff_retaddr;
  int pos;
  int len;
  int start;
  uint32_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  iVar1 = lre_check_stack_overflow
                    ((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 == 0) {
    iVar1 = (int)(in_RDI->byte_code).size;
    iVar2 = re_parse_alternative(_pos,unaff_retaddr);
    if (iVar2 == 0) {
      while (*in_RDI->buf_ptr == '|') {
        in_RDI->buf_ptr = in_RDI->buf_ptr + 1;
        iVar2 = (int)(in_RDI->byte_code).size - iVar1;
        iVar3 = dbuf_insert((DynBuf *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                            0,0x1c811d);
        if (iVar3 != 0) {
          iVar1 = re_parse_out_of_memory((REParseState *)0x1c812c);
          return iVar1;
        }
        (in_RDI->byte_code).buf[iVar1] = '\t';
        put_u32((in_RDI->byte_code).buf + (long)iVar1 + 1,iVar2 + 5);
        in_stack_ffffffffffffffe0 =
             re_emit_op_u32((REParseState *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
        iVar2 = re_parse_alternative(_pos,unaff_retaddr);
        if (iVar2 != 0) {
          return -1;
        }
        put_u32((in_RDI->byte_code).buf + in_stack_ffffffffffffffe0,
                (int)(in_RDI->byte_code).size - (in_stack_ffffffffffffffe0 + 4));
      }
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = re_parse_error(in_RDI,"stack overflow");
  }
  return local_4;
}

Assistant:

static int re_parse_disjunction(REParseState *s, BOOL is_backward_dir)
{
    int start, len, pos;

    if (lre_check_stack_overflow(s->opaque, 0))
        return re_parse_error(s, "stack overflow");
    
    start = s->byte_code.size;
    if (re_parse_alternative(s, is_backward_dir))
        return -1;
    while (*s->buf_ptr == '|') {
        s->buf_ptr++;

        len = s->byte_code.size - start;

        /* insert a split before the first alternative */
        if (dbuf_insert(&s->byte_code, start, 5)) {
            return re_parse_out_of_memory(s);
        }
        s->byte_code.buf[start] = REOP_split_next_first;
        put_u32(s->byte_code.buf + start + 1, len + 5);

        pos = re_emit_op_u32(s, REOP_goto, 0);

        if (re_parse_alternative(s, is_backward_dir))
            return -1;
        
        /* patch the goto */
        len = s->byte_code.size - (pos + 4);
        put_u32(s->byte_code.buf + pos, len);
    }
    return 0;
}